

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void __thiscall ktxValidator::validateKvd(ktxValidator *this,validationContext *ctx)

{
  severity sVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  uint *puVar6;
  size_t sVar7;
  undefined8 *in_RSI;
  uint8_t *value;
  char *key_1;
  uint32_t valueLen;
  uint32_t keyLen_1;
  char *key;
  uint32_t keyLen;
  bool writerScParamsFound;
  bool writerFound;
  ktx_error_code_e result;
  uint32_t prevKeyLen;
  char *prevKey;
  ktxHashListEntry *entry;
  ktxHashList kvDataHead;
  bool noNul;
  bool bom;
  uint8_t *pCurKvEnd;
  uint8_t *p;
  uint32_t curKvLen;
  uint32_t safetyCount;
  uint8_t *pCurKv;
  uint8_t *kvd;
  bool allKeysNulTerminated;
  uint32_t lengthCheck;
  uint32_t kvdLen;
  issue *in_stack_fffffffffffffcc8;
  issue *in_stack_fffffffffffffcd0;
  size_t in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffce0;
  uchar *in_stack_fffffffffffffd18;
  issue *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  severity in_stack_fffffffffffffd2c;
  ktxValidator *in_stack_fffffffffffffd30;
  ktxValidator *in_stack_fffffffffffffd38;
  issue local_2b8 [4];
  undefined1 local_218 [8];
  char *local_210;
  undefined1 local_208 [4];
  undefined1 local_204 [44];
  char *local_1d8;
  undefined1 local_1cc [50];
  byte local_19a;
  byte local_199;
  int local_198;
  undefined1 local_194 [4];
  char *local_190;
  long local_188;
  long local_180 [16];
  uchar local_100 [40];
  issue local_d8;
  byte local_aa;
  byte local_a9;
  uint *local_a8;
  uint *local_a0;
  uint local_98;
  uint local_94;
  uint *local_90;
  undefined1 local_88 [96];
  uint *local_28;
  undefined1 local_19;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 *local_10;
  
  local_14 = *(undefined4 *)((long)in_RSI + 0x44);
  local_18 = 0;
  local_19 = 1;
  if (local_14 != 0) {
    local_10 = in_RSI;
    local_28 = (uint *)operator_new__((ulong)(uint)local_14);
    std::istream::read((char *)*local_10,(long)local_28);
    uVar4 = std::ios::fail();
    if ((uVar4 & 1) == 0) {
      uVar4 = std::ios::eof();
      if ((uVar4 & 1) != 0) {
        in_stack_fffffffffffffd30 = (ktxValidator *)local_88;
        ::issue::issue(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        addIssue<>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20);
        ::issue::~issue((issue *)0x11050b);
      }
    }
    else {
      in_stack_fffffffffffffd38 = (ktxValidator *)(local_88 + 0x38);
      ::issue::issue(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      piVar5 = __errno_location();
      strerror(*piVar5);
      addIssue<char*>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20,
                      (char *)in_stack_fffffffffffffd18);
      ::issue::~issue((issue *)0x110487);
    }
    local_90 = local_28;
    local_94 = 0;
    while( true ) {
      sVar1 = in_stack_fffffffffffffd2c & 0xffffff;
      if ((uint)local_18 < (uint)local_14) {
        sVar1 = CONCAT13(local_94 < 0x4b,(int3)in_stack_fffffffffffffd2c);
      }
      in_stack_fffffffffffffd2c = sVar1;
      if ((char)(in_stack_fffffffffffffd2c >> 0x18) == '\0') break;
      local_98 = *local_90;
      local_18 = local_18 + 4;
      puVar6 = local_90 + 1;
      local_a8 = (uint *)((long)puVar6 + (ulong)local_98);
      local_a9 = 0;
      local_a0 = puVar6;
      if ((((char)*puVar6 == -0x11) && (*(char *)((long)local_90 + 5) == -0x45)) &&
         (*(char *)((long)local_90 + 6) == -0x41)) {
        local_a9 = 1;
        local_a0 = (uint *)((long)local_90 + 7);
      }
      for (; (local_a0 < local_a8 && ((char)*local_a0 != '\0'));
          local_a0 = (uint *)((long)local_a0 + 1)) {
      }
      local_aa = local_a0 == local_a8;
      local_90 = puVar6;
      if ((bool)local_aa) {
        in_stack_fffffffffffffd20 = &local_d8;
        ::issue::issue(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        addIssue<unsigned_char*>
                  (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20,
                   in_stack_fffffffffffffd18);
        ::issue::~issue((issue *)0x1106e7);
        local_19 = 0;
      }
      if ((local_a9 & 1) != 0) {
        if ((local_aa & 1) == 0) {
          ::issue::issue(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          addIssue<unsigned_char*>
                    (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20,
                     in_stack_fffffffffffffd18);
          ::issue::~issue((issue *)0x1107e2);
        }
        else {
          in_stack_fffffffffffffd18 = local_100;
          ::issue::issue(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          addIssue<unsigned_char*>
                    (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20,
                     in_stack_fffffffffffffd18);
          ::issue::~issue((issue *)0x110773);
        }
      }
      sVar7 = padn((uint32_t)((ulong)in_stack_fffffffffffffce0 >> 0x20),in_stack_fffffffffffffcd8);
      local_98 = (uint)sVar7;
      local_18 = local_98 + local_18;
      local_90 = (uint *)((long)local_90 + (sVar7 & 0xffffffff));
      local_94 = local_94 + 1;
    }
    if (local_94 == 0x4b) {
      ::issue::issue(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      addIssue<int>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20,
                    (int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
      ::issue::~issue((issue *)0x1108b8);
    }
    else if (local_18 != local_14) {
      ::issue::issue(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      addIssue<>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20);
      ::issue::~issue((issue *)0x11092f);
    }
    local_180[0] = 0;
    local_199 = 0;
    local_19a = 0;
    if ((local_19 & 1) != 0) {
      local_198 = ktxHashList_Deserialize(local_180,local_14,local_28);
      if (local_198 == 0) {
        ktxHashListEntry_GetKey(local_180[0],local_194,&local_190);
        for (local_188 = ktxHashList_Next(local_180[0]); local_188 != 0;
            local_188 = ktxHashList_Next(local_188)) {
          ktxHashListEntry_GetKey(local_188,local_1cc,&local_1d8);
          iVar3 = strcmp(local_190,local_1d8);
          if (0 < iVar3) {
            ::issue::issue(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
            addIssue<>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20
                      );
            ::issue::~issue((issue *)0x110acb);
            break;
          }
        }
        for (local_188 = local_180[0]; local_188 != 0; local_188 = ktxHashList_Next(local_188)) {
          ktxHashListEntry_GetKey(local_188,local_204,&local_210);
          ktxHashListEntry_GetValue(local_188,local_208,local_218);
          iVar3 = strncasecmp(local_210,"KTX",3);
          if (iVar3 == 0) {
            bVar2 = validateMetadata(in_stack_fffffffffffffd38,
                                     (validationContext *)in_stack_fffffffffffffd30,
                                     (char *)CONCAT44(in_stack_fffffffffffffd2c,
                                                      in_stack_fffffffffffffd28),
                                     (uint8_t *)in_stack_fffffffffffffd20,
                                     (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20));
            if (!bVar2) {
              ::issue::issue(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
              addIssue<char*>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,
                              in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
              ::issue::~issue((issue *)0x110bfc);
            }
            iVar3 = strncmp(local_210,"KTXwriter",9);
            if (iVar3 == 0) {
              local_199 = 1;
            }
            iVar3 = strncmp(local_210,"KTXwriterScParams",0x11);
            if (iVar3 == 0) {
              local_19a = 1;
            }
          }
          else {
            ::issue::issue(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
            addIssue<char*>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,
                            in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
            ::issue::~issue((issue *)0x110cb3);
          }
        }
        if ((local_199 & 1) == 0) {
          if ((local_19a & 1) == 0) {
            ::issue::issue(local_2b8,in_stack_fffffffffffffcc8);
            addIssue<>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20
                      );
            ::issue::~issue((issue *)0x110dac);
          }
          else {
            ::issue::issue(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
            addIssue<>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20
                      );
            ::issue::~issue((issue *)0x110d4b);
          }
        }
      }
      else {
        ::issue::issue(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        addIssue<>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20);
        ::issue::~issue((issue *)0x1109ec);
      }
    }
  }
  return;
}

Assistant:

void
ktxValidator::validateKvd(validationContext& ctx)
{
    uint32_t kvdLen = ctx.header.keyValueData.byteLength;
    uint32_t lengthCheck = 0;
    bool allKeysNulTerminated = true;

    if (kvdLen == 0)
        return;

    uint8_t* kvd = new uint8_t[kvdLen];
    ctx.inp->read((char *)kvd, kvdLen);
    if (ctx.inp->fail())
        addIssue(logger::eFatal, IOError.FileRead, strerror(errno));
    else if (ctx.inp->eof())
        addIssue(logger::eFatal, IOError.UnexpectedEOF);

    // Check all kv pairs have valuePadding and it's included in kvdLen;
    uint8_t* pCurKv = kvd;
    uint32_t safetyCount;
    // safetyCount ensures we don't get stuck in an infinite loop in the event
    // the kv data is completely bogus and the "lengths" never add up to kvdLen.
#define MAX_KVPAIRS 75
    for (safetyCount = 0; lengthCheck < kvdLen && safetyCount < MAX_KVPAIRS; safetyCount++) {
        uint32_t curKvLen = *(uint32_t *)pCurKv;
        lengthCheck += sizeof(uint32_t); // Add keyAndValueByteLength to total.
        pCurKv += sizeof(uint32_t); // Move pointer past keyAndValueByteLength.
        uint8_t* p = pCurKv;
        uint8_t* pCurKvEnd = pCurKv + curKvLen;

        // Check for BOM.
        bool bom = false;
        if (*p == 0xEF && *(p+1) == 0xBB && *(p+2) == 0xBF) {
            bom = true;
            p += 3;
        }
        for (; p < pCurKvEnd; p++) {
            if (*p == '\0')
              break;
        }
        bool noNul = (p == pCurKvEnd);
        if (noNul) {
            addIssue(logger::eError, Metadata.MissingNulTerminator, pCurKv);
            allKeysNulTerminated = false;
        }
        if (bom) {
            if (noNul)
                addIssue(logger::eError, Metadata.ForbiddenBOM1, pCurKv);
            else
                addIssue(logger::eError, Metadata.ForbiddenBOM2, pCurKv);
        }
        curKvLen = (uint32_t)padn(4, curKvLen);
        lengthCheck += curKvLen;
        pCurKv += curKvLen;
    }
    if (safetyCount == 75)
        addIssue(logger::eError, Metadata.InvalidStructure, MAX_KVPAIRS);
    else if (lengthCheck != kvdLen)
        addIssue(logger::eError, Metadata.MissingFinalPadding);

    ktxHashList kvDataHead = 0;
    ktxHashListEntry* entry;
    char* prevKey;
    uint32_t prevKeyLen;
    KTX_error_code result;
    bool writerFound = false;
    bool writerScParamsFound = false;

    if (allKeysNulTerminated) {
        result = ktxHashList_Deserialize(&kvDataHead, kvdLen, kvd);
        if (result != KTX_SUCCESS) {
            addIssue(logger::eError, System.OutOfMemory);
            return;
        }

        // Check the entries are sorted
        ktxHashListEntry_GetKey(kvDataHead, &prevKeyLen, &prevKey);
        entry = ktxHashList_Next(kvDataHead);
        for (; entry != NULL; entry = ktxHashList_Next(entry)) {
            uint32_t keyLen;
            char* key;

            ktxHashListEntry_GetKey(entry, &keyLen, &key);
            if (strcmp(prevKey, key) > 0) {
                addIssue(logger::eError, Metadata.OutOfOrder);
                break;
            }
        }

        for (entry = kvDataHead; entry != NULL; entry = ktxHashList_Next(entry)) {
            uint32_t keyLen, valueLen;
            char* key;
            uint8_t* value;

            ktxHashListEntry_GetKey(entry, &keyLen, &key);
            ktxHashListEntry_GetValue(entry, &valueLen, (void**)&value);
            if (strncasecmp(key, "KTX", 3) == 0) {
                if (!validateMetadata(ctx, key, value, valueLen)) {
                    addIssue(logger::eError, Metadata.IllegalMetadata, key);
                }
                if (strncmp(key, "KTXwriter", 9) == 0)
                    writerFound = true;
                if (strncmp(key, "KTXwriterScParams", 17) == 0)
                    writerScParamsFound = true;
            } else {
                addIssue(logger::eWarning, Metadata.CustomMetadata, key);
            }
        }
        if (!writerFound) {
            if (writerScParamsFound)
                addIssue(logger::eError, Metadata.NoRequiredKTXwriter);
            else
                addIssue(logger::eWarning, Metadata.NoKTXwriter);
        }
    }
}